

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cClipControlTests.cpp
# Opt level: O0

IterateResult __thiscall gl4cts::ClipControlModifyGetState::iterate(ClipControlModifyGetState *this)

{
  TestContext *this_00;
  bool bVar1;
  int iVar2;
  deUint32 err;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestError *this_01;
  char *description;
  ulong local_50;
  size_t i;
  GLenum cases [4] [2];
  ClipControlApi cc;
  Functions *gl;
  ClipControlModifyGetState *this_local;
  
  pRVar3 = deqp::Context::getRenderContext
                     ((this->super_ClipControlBaseTest).super_TestCase.m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  ClipControlApi::ClipControlApi
            ((ClipControlApi *)(cases + 3),
             (this->super_ClipControlBaseTest).super_TestCase.m_context,
             (this->super_ClipControlBaseTest).m_api);
  cases[0][0] = 0x8ca2;
  cases[0][1] = 0x935e;
  cases[1][0] = 0x8ca1;
  cases[1][1] = 0x935f;
  cases[2][0] = 0x8ca1;
  cases[2][1] = 0x935e;
  local_50 = 0;
  while( true ) {
    if (3 < local_50) {
      this_00 = (this->super_ClipControlBaseTest).super_TestCase.super_TestCase.super_TestNode.
                m_testCtx;
      description = qpGetTestResultName(QP_TEST_RESULT_PASS);
      tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,description);
      return STOP;
    }
    (*(code *)cases[3])(cases[local_50 - 1][0],cases[local_50 - 1][1]);
    err = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
    glu::checkError(err,"ClipControl()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cClipControlTests.cpp"
                    ,0x126);
    bVar1 = ClipControlBaseTest::verifyState
                      (&this->super_ClipControlBaseTest,cases[local_50 - 1][0],
                       cases[local_50 - 1][1]);
    if (!bVar1) break;
    local_50 = local_50 + 1;
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,"Wrong ClipControl state after ClipControl() call",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cClipControlTests.cpp"
             ,0x129);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

IterateResult iterate()
	{
		const glw::Functions& gl = m_context.getRenderContext().getFunctions();
		ClipControlApi		  cc(m_context, m_api);

		GLenum cases[4][2] = {
			{ GL_UPPER_LEFT, GL_ZERO_TO_ONE },
			{ GL_UPPER_LEFT, GL_NEGATIVE_ONE_TO_ONE },
			{ GL_LOWER_LEFT, GL_ZERO_TO_ONE },
			{ GL_LOWER_LEFT, GL_NEGATIVE_ONE_TO_ONE },
		};

		for (size_t i = 0; i < DE_LENGTH_OF_ARRAY(cases); i++)
		{
			cc.clipControl(cases[i][0], cases[i][1]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "ClipControl()");
			if (!verifyState(cases[i][0], cases[i][1]))
			{
				TCU_FAIL("Wrong ClipControl state after ClipControl() call");
			}
		}

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, qpGetTestResultName(QP_TEST_RESULT_PASS));
		return STOP;
	}